

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

bool __thiscall FCompressedFile::Open(FCompressedFile *this,char *name,EOpenMode mode)

{
  FILE *pFVar1;
  char *__modes;
  bool bVar2;
  
  (*(this->super_FFile)._vptr_FFile[3])();
  if (name == (char *)0x0) {
    bVar2 = false;
  }
  else {
    this->m_Mode = mode;
    __modes = "wb";
    if (mode == EReading) {
      __modes = "rb";
    }
    pFVar1 = fopen(name,__modes);
    this->m_File = (FILE *)pFVar1;
    PostOpen(this);
    bVar2 = this->m_File != (FILE *)0x0;
  }
  return bVar2;
}

Assistant:

bool FCompressedFile::Open (const char *name, EOpenMode mode)
{
	Close ();
	if (name == NULL)
		return false;
	m_Mode = mode;
	m_File = fopen (name, mode == EReading ? "rb" : "wb");
	PostOpen ();
	return !!m_File;
}